

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O0

size_t __thiscall
ProblemFireFighting::NumberOfContainedStartPositions
          (ProblemFireFighting *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *state)

{
  const_reference pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index i;
  size_t nrSPs;
  size_type in_stack_ffffffffffffffc8;
  uint local_24;
  size_t local_20;
  size_t local_8;
  
  if (((ulong)in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    local_8 = 0;
  }
  else {
    local_20 = 0;
    for (local_24 = (uint)in_RDI[0x17].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        (pointer)(ulong)local_24 <
        in_RDI[0x18].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start; local_24 = local_24 + 1) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (in_RDI,in_stack_ffffffffffffffc8);
      if ((pointer)(ulong)*pvVar1 ==
          in_RDI[0x17].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_20 = local_20 + 1;
      }
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

size_t ProblemFireFighting::
NumberOfContainedStartPositions(const vector<Index>& state) 
    const
{
    if(!_m_includePositions)
        return(0);

    size_t nrSPs = 0;
    //loop over the position features:
    for(Index i = _m_nrHouses; i < _m_nrStateFeatures; i++)
        if(state.at(i) == _m_nrHouses) //the 'start' postion index = nrHouses
            nrSPs++;
    return nrSPs;
    
}